

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_SHA3.c
# Opt level: O3

void Hacl_Hash_SHA3_free(Hacl_Hash_SHA3_state_t *state)

{
  uint8_t *__ptr;
  
  __ptr = state->buf;
  free((state->block_state).snd);
  free(__ptr);
  free(state);
  return;
}

Assistant:

void Hacl_Hash_SHA3_free(Hacl_Hash_SHA3_state_t *state)
{
  Hacl_Hash_SHA3_state_t scrut = *state;
  uint8_t *buf = scrut.buf;
  Hacl_Hash_SHA3_hash_buf block_state = scrut.block_state;
  uint64_t *s = block_state.snd;
  KRML_HOST_FREE(s);
  KRML_HOST_FREE(buf);
  KRML_HOST_FREE(state);
}